

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

void Exp_Truth(int nVars,Vec_Int_t *p,word *pRes)

{
  int iVar1;
  word **puFanins_00;
  word *pwVar2;
  word **puNodes_00;
  word *pRes_00;
  word wVar3;
  int local_50;
  uint local_48;
  int nWords;
  int w;
  int i;
  word *pTemp1;
  word *pTemp0;
  word **puNodes;
  word **puFanins;
  word *pRes_local;
  Vec_Int_t *p_local;
  int nVars_local;
  
  if (nVars < 7) {
    local_50 = 1;
  }
  else {
    local_50 = 1 << ((char)nVars - 6U & 0x1f);
  }
  puFanins_00 = (word **)malloc((long)nVars << 3);
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    pwVar2 = (word *)malloc((long)local_50 << 3);
    puFanins_00[nWords] = pwVar2;
  }
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    if (nWords < 6) {
      for (local_48 = 0; (int)local_48 < local_50; local_48 = local_48 + 1) {
        puFanins_00[nWords][(int)local_48] = Exp_Truth::Truth6[nWords];
      }
    }
    else {
      for (local_48 = 0; (int)local_48 < local_50; local_48 = local_48 + 1) {
        wVar3 = 0;
        if ((local_48 & 1 << ((char)nWords - 6U & 0x1f)) != 0) {
          wVar3 = 0xffffffffffffffff;
        }
        puFanins_00[nWords][(int)local_48] = wVar3;
      }
    }
  }
  iVar1 = Exp_NodeNum(p);
  puNodes_00 = (word **)malloc((long)iVar1 << 3);
  for (nWords = 0; iVar1 = Exp_NodeNum(p), nWords < iVar1; nWords = nWords + 1) {
    pwVar2 = (word *)malloc((long)local_50 << 3);
    puNodes_00[nWords] = pwVar2;
  }
  pwVar2 = (word *)malloc((long)local_50 << 3);
  pRes_00 = (word *)malloc((long)local_50 << 3);
  for (nWords = 0; iVar1 = Exp_NodeNum(p), nWords < iVar1; nWords = nWords + 1) {
    iVar1 = Vec_IntEntry(p,nWords << 1);
    Exp_TruthLit(nVars,iVar1,puFanins_00,puNodes_00,pwVar2,local_50);
    iVar1 = Vec_IntEntry(p,nWords * 2 + 1);
    Exp_TruthLit(nVars,iVar1,puFanins_00,puNodes_00,pRes_00,local_50);
    for (local_48 = 0; (int)local_48 < local_50; local_48 = local_48 + 1) {
      puNodes_00[nWords][(int)local_48] = pwVar2[(int)local_48] & pRes_00[(int)local_48];
    }
  }
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
  }
  if (pRes_00 != (word *)0x0) {
    free(pRes_00);
  }
  iVar1 = Vec_IntEntryLast(p);
  Exp_TruthLit(nVars,iVar1,puFanins_00,puNodes_00,pRes,local_50);
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    if (puFanins_00[nWords] != (word *)0x0) {
      free(puFanins_00[nWords]);
      puFanins_00[nWords] = (word *)0x0;
    }
  }
  if (puFanins_00 != (word **)0x0) {
    free(puFanins_00);
  }
  for (nWords = 0; iVar1 = Exp_NodeNum(p), nWords < iVar1; nWords = nWords + 1) {
    if (puNodes_00[nWords] != (word *)0x0) {
      free(puNodes_00[nWords]);
      puNodes_00[nWords] = (word *)0x0;
    }
  }
  if (puNodes_00 != (word **)0x0) {
    free(puNodes_00);
  }
  return;
}

Assistant:

static inline void Exp_Truth( int nVars, Vec_Int_t * p, word * pRes )
{
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    word ** puFanins, ** puNodes, * pTemp0, * pTemp1;
    int i, w, nWords = (nVars <= 6 ? 1 : 1 << (nVars-6));
    // create elementary variables
    puFanins = ABC_ALLOC( word *, nVars );
    for ( i = 0; i < nVars; i++ )
        puFanins[i] = ABC_ALLOC( word, nWords );
    // assign elementary truth tables
    for ( i = 0; i < nVars; i++ )
        if ( i < 6 )
            for ( w = 0; w < nWords; w++ )
                puFanins[i][w] = Truth6[i];
        else
            for ( w = 0; w < nWords; w++ )
                puFanins[i][w] = (w & (1 << (i-6))) ? ~(word)0 : 0;
    // create intermediate nodes
    puNodes = ABC_ALLOC( word *, Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
        puNodes[i] = ABC_ALLOC( word, nWords );
    // evaluate the expression
    pTemp0 = ABC_ALLOC( word, nWords );
    pTemp1 = ABC_ALLOC( word, nWords );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
    {
        Exp_TruthLit( nVars, Vec_IntEntry(p, 2*i+0), puFanins, puNodes, pTemp0, nWords );
        Exp_TruthLit( nVars, Vec_IntEntry(p, 2*i+1), puFanins, puNodes, pTemp1, nWords );
        for ( w = 0; w < nWords; w++ )
            puNodes[i][w] = pTemp0[w] & pTemp1[w];
    }
    ABC_FREE( pTemp0 );
    ABC_FREE( pTemp1 );
    // copy the final result
    Exp_TruthLit( nVars, Vec_IntEntryLast(p), puFanins, puNodes, pRes, nWords );
    // cleanup
    for ( i = 0; i < nVars; i++ )
        ABC_FREE( puFanins[i] );
    ABC_FREE( puFanins );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
        ABC_FREE( puNodes[i] );
    ABC_FREE( puNodes );
}